

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O2

FString __thiscall FString::operator+(FString *this,char tail)

{
  char in_DL;
  undefined7 in_register_00000031;
  
  FString(this,(FString *)CONCAT71(in_register_00000031,tail),in_DL);
  return (FString)(char *)this;
}

Assistant:

FString FString::operator + (char tail) const
{
	return FString (*this, tail);
}